

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::base_access<9>::plus_overflows<units::detail::unit_data>
               (unit_data *a,unit_data *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((int)*a << 4) >> 0x1e;
  iVar2 = ((int)*b << 4) >> 0x1e;
  if (0 < iVar2) {
    return 1 - iVar2 < iVar1;
  }
  if (-1 < iVar2) {
    return false;
  }
  return iVar1 < -2 - iVar2;
}

Assistant:

constexpr int count() const { return count_; }